

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O2

byte * __thiscall
Js::ByteCodeBufferReader::DeserializeFloatArray
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto)

{
  uint uVar1;
  uint uVar2;
  code *pcVar3;
  ulong uVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  byte *pbVar8;
  uint index;
  ulong uVar9;
  byte *buffer_00;
  double local_48;
  double value;
  ulong local_38;
  
  uVar1 = *(uint *)buffer;
  value = (double)this;
  uVar6 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar6 <= (ulong)uVar1 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x12c2,
                                "(serialized->offset + sizeof(AuxArray<double>) < deserializeInto->GetLength())"
                                ,
                                "serialized->offset + sizeof(AuxArray<double>) < deserializeInto->GetLength()"
                               );
    if (!bVar5) goto LAB_007c717d;
    *puVar7 = 0;
  }
  pbVar8 = ByteBlock::GetBuffer(deserializeInto);
  local_38 = (ulong)*(uint *)buffer;
  uVar1 = *(uint *)(buffer + 5);
  *(uint *)(pbVar8 + local_38) = uVar1;
  uVar2 = *(uint *)buffer;
  uVar6 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar6 < (ulong)uVar2 + (ulong)uVar1 * 8 + 8) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x12c6,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar5) {
LAB_007c717d:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  uVar4 = local_38;
  buffer_00 = buffer + 9;
  for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
    buffer_00 = ReadDouble((ByteCodeBufferReader *)value,buffer_00,&local_48);
    *(double *)(pbVar8 + uVar9 * 8 + uVar4 + 8) = local_48;
  }
  return buffer_00;
}

Assistant:

const byte *
    DeserializeFloatArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto)
    {
        auto serialized = (serialization_alignment const SerializedFloatArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxFltArray);
#endif
        Assert(serialized->offset + sizeof(AuxArray<double>) < deserializeInto->GetLength());
        auto result = (AuxArray<double> *)(deserializeInto->GetBuffer() + serialized->offset);
        uint count = serialized->floatCount;
        result->count = count;
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());

        auto content = (const byte*)(serialized + 1);
        auto current = content;
        for (uint index = 0; index < count; index++)
        {
            double value;
            current = ReadDouble(current, &value);
            result->elements[index] = value;
        }
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxFltArray);
#endif
        return current;
    }